

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runxmlconf.c
# Opt level: O3

void testErrorHandler(void *userData,xmlErrorPtr error)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  int *piVar4;
  
  lVar2 = (long)testErrorsSize;
  if (0x7fff < lVar2) {
    return;
  }
  pcVar3 = "entity";
  if (error->file != (char *)0x0) {
    pcVar3 = error->file;
  }
  iVar1 = snprintf(testErrors + lVar2,(ulong)(0x8000 - testErrorsSize),"%s:%d: %s\n",pcVar3,
                   (ulong)(uint)error->line,error->message,lVar2);
  if (error->level == XML_ERR_FATAL) {
    piVar4 = &nbFatal;
  }
  else {
    if (error->level != XML_ERR_ERROR) goto LAB_0010287a;
    piVar4 = &nbError;
  }
  *piVar4 = *piVar4 + 1;
LAB_0010287a:
  testErrorsSize = iVar1 + testErrorsSize;
  if (0x7fff < testErrorsSize) {
    testErrors[0x8000] = '\0';
    testErrorsSize = 0x8000;
  }
  testErrors[testErrorsSize] = '\0';
  return;
}

Assistant:

static void
testErrorHandler(void *userData ATTRIBUTE_UNUSED, xmlErrorPtr error) {
    int res;

    if (testErrorsSize >= 32768)
        return;
    res = snprintf(&testErrors[testErrorsSize],
                    32768 - testErrorsSize,
		   "%s:%d: %s\n", (error->file ? error->file : "entity"),
		   error->line, error->message);
    if (error->level == XML_ERR_FATAL)
        nbFatal++;
    else if (error->level == XML_ERR_ERROR)
        nbError++;
    if (testErrorsSize + res >= 32768) {
        /* buffer is full */
	testErrorsSize = 32768;
	testErrors[testErrorsSize] = 0;
    } else {
        testErrorsSize += res;
    }
    testErrors[testErrorsSize] = 0;
}